

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O3

int rops_handle_POLLOUT_h2(lws *wsi)

{
  int iVar1;
  
  iVar1 = 2;
  if ((((short)wsi->wsistate != 0x14) && ((*(ulong *)&wsi->field_0x2dc & 0x40000000000004) != 0)) &&
     (((wsi->h2).h2n)->pps != (lws_h2_protocol_send *)0x0)) {
    _lws_log(8,"servicing pps\n");
    iVar1 = lws_h2_do_pps_send(wsi);
    if (iVar1 == 0) {
      iVar1 = 0;
      if (((wsi->h2).h2n)->pps == (lws_h2_protocol_send *)0x0) {
        lws_rx_flow_control(wsi,0x6080);
        iVar1 = 0;
      }
    }
    else {
      wsi->field_0x2dd = wsi->field_0x2dd | 0x10;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int rops_handle_POLLOUT_h2(struct lws *wsi)
{
	// lwsl_notice("%s\n", __func__);

	if (lwsi_state(wsi) == LRS_ISSUE_HTTP_BODY)
		return LWS_HP_RET_USER_SERVICE;

	/*
	 * Priority 1: H2 protocol packets
	 */
	if ((wsi->upgraded_to_http2
#if defined(LWS_WITH_CLIENT)
			|| wsi->client_h2_alpn
#endif
			) && wsi->h2.h2n->pps) {
		lwsl_info("servicing pps\n");
		/*
		 * this is called on the network connection, but may close
		 * substreams... that may affect callers
		 */
		if (lws_h2_do_pps_send(wsi)) {
			wsi->socket_is_permanently_unusable = 1;
			return LWS_HP_RET_BAIL_DIE;
		}
		if (wsi->h2.h2n->pps)
			return LWS_HP_RET_BAIL_OK;

		/* we can resume whatever we were doing */
		lws_rx_flow_control(wsi, LWS_RXFLOW_REASON_APPLIES_ENABLE |
					 LWS_RXFLOW_REASON_H2_PPS_PENDING);

		return LWS_HP_RET_BAIL_OK; /* leave POLLOUT active */
	}

	/* Priority 2: if we are closing, not allowed to send more data frags
	 *	       which means user callback or tx ext flush banned now
	 */
	if (lwsi_state(wsi) == LRS_RETURNED_CLOSE)
		return LWS_HP_RET_USER_SERVICE;

	return LWS_HP_RET_USER_SERVICE;
}